

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock_wait.cc
# Opt level: O2

uint32_t absl::lts_20250127::base_internal::SpinLockWait
                   (atomic<unsigned_int> *w,int n,SpinLockWaitTransition *trans,
                   SchedulingMode scheduling_mode)

{
  uint32_t value;
  uint32_t uVar1;
  long lVar2;
  int iVar3;
  bool bVar4;
  
  iVar3 = 0;
LAB_0028ed0e:
  do {
    value = (w->super___atomic_base<unsigned_int>)._M_i;
    for (lVar2 = 0; (ulong)(uint)n * 0xc - lVar2 != 0; lVar2 = lVar2 + 0xc) {
      if (value == *(uint32_t *)((long)&trans->from + lVar2)) {
        uVar1 = *(uint32_t *)((long)&trans->to + lVar2);
        if (uVar1 != value) {
          LOCK();
          bVar4 = value == (w->super___atomic_base<unsigned_int>)._M_i;
          if (bVar4) {
            (w->super___atomic_base<unsigned_int>)._M_i = uVar1;
          }
          UNLOCK();
          if (!bVar4) goto LAB_0028ed0e;
        }
        if ((&trans->done)[lVar2] == true) {
          return value;
        }
        goto LAB_0028ed0e;
      }
    }
    iVar3 = iVar3 + 1;
    AbslInternalSpinLockDelay_lts_20250127(w,value,iVar3,scheduling_mode);
  } while( true );
}

Assistant:

uint32_t SpinLockWait(std::atomic<uint32_t> *w, int n,
                      const SpinLockWaitTransition trans[],
                      base_internal::SchedulingMode scheduling_mode) {
  int loop = 0;
  for (;;) {
    uint32_t v = w->load(std::memory_order_acquire);
    int i;
    for (i = 0; i != n && v != trans[i].from; i++) {
    }
    if (i == n) {
      SpinLockDelay(w, v, ++loop, scheduling_mode);  // no matching transition
    } else if (trans[i].to == v ||                   // null transition
               w->compare_exchange_strong(v, trans[i].to,
                                          std::memory_order_acquire,
                                          std::memory_order_relaxed)) {
      if (trans[i].done) return v;
    }
  }
}